

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall
SceneRender::setShaders
          (SceneRender *this,Uniforms *_uniforms,string *_fragmentShader,string *_vertexShader)

{
  ulong *puVar1;
  vector<vera::Model_*,_std::allocator<vera::Model_*>_> *pvVar2;
  pointer *pppMVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  mapped_type pSVar5;
  pointer ppMVar6;
  pointer ppMVar7;
  iterator iVar8;
  SceneRender *pSVar9;
  string *program;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  undefined8 *puVar14;
  long *plVar15;
  mapped_type *ppSVar16;
  _Base_ptr p_Var17;
  Model *pMVar18;
  long lVar19;
  size_type *psVar20;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders extraout_EDX_01;
  DefaultShaders DVar21;
  DefaultShaders _type;
  DefaultShaders _type_00;
  DefaultShaders _type_01;
  DefaultShaders _type_02;
  DefaultShaders _type_03;
  DefaultShaders _type_04;
  DefaultShaders extraout_EDX_02;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders extraout_EDX_05;
  DefaultShaders extraout_EDX_06;
  DefaultShaders extraout_EDX_07;
  long lVar22;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  undefined8 uVar23;
  char *__end;
  Shader *pSVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  string bufferName;
  string local_2b8;
  string local_298;
  string *local_278;
  SceneRender *local_270;
  string *local_268;
  string local_260;
  undefined1 local_240 [168];
  undefined1 local_198 [32];
  ShaderMap *local_178;
  Model *local_170;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  _Rb_tree_node_base *local_a8;
  int local_9c [3];
  string local_90;
  string local_70;
  string local_50;
  
  local_278 = _vertexShader;
  local_268 = _fragmentShader;
  bVar10 = checkBackground(_fragmentShader);
  this->m_background = bVar10;
  local_270 = this;
  if (!bVar10) goto LAB_001cb116;
  local_240._0_8_ = local_240 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"BACKGROUND","");
  paVar4 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  pSVar24 = &local_270->m_background_shader;
  vera::HaveDefines::addDefine(&pSVar24->super_HaveDefines,(string *)local_240,&local_2b8);
  DVar21 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    DVar21 = extraout_EDX_00;
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
    DVar21 = extraout_EDX_01;
  }
  vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x5,DVar21);
  vera::Shader::setSource(pSVar24,local_268,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  local_240._0_8_ = local_240 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"GLSLVIEWER","");
  local_9c[2] = 3;
  vera::toString<int>((string *)local_198,local_9c + 2);
  local_9c[1] = 3;
  vera::toString<int>(&local_260,local_9c + 1);
  uVar25 = 0xf;
  if ((Model *)local_198._0_8_ != (Model *)(local_198 + 0x10)) {
    uVar25 = local_198._16_8_;
  }
  if (uVar25 < local_260._M_string_length + local_198._8_8_) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      uVar23 = local_260.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_260._M_string_length + local_198._8_8_) goto LAB_001caf26;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,local_198._0_8_);
  }
  else {
LAB_001caf26:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append(local_198,(ulong)local_260._M_dataplus._M_p);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  puVar1 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_298.field_2._M_allocated_capacity = *puVar1;
    local_298.field_2._8_8_ = puVar14[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar1;
    local_298._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_298._M_string_length = puVar14[1];
  *puVar14 = puVar1;
  puVar14[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_9c[0] = 0;
  vera::toString<int>(&local_128,local_9c);
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    uVar23 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_128._M_string_length + local_298._M_string_length) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar23 = local_128.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_128._M_string_length + local_298._M_string_length) goto LAB_001caffd;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_128,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
  }
  else {
LAB_001caffd:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_128._M_dataplus._M_p);
  }
  psVar20 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_2b8.field_2._M_allocated_capacity = *psVar20;
    local_2b8.field_2._8_8_ = puVar14[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar20;
    local_2b8._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_2b8._M_string_length = puVar14[1];
  *puVar14 = psVar20;
  puVar14[1] = 0;
  *(undefined1 *)psVar20 = 0;
  vera::HaveDefines::addDefine(&pSVar24->super_HaveDefines,(string *)local_240,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((Model *)local_198._0_8_ != (Model *)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
LAB_001cb116:
  program = local_268;
  bVar10 = findId(local_268,"u_scenePosition;");
  local_178 = (ShaderMap *)CONCAT71(local_178._1_7_,bVar10);
  bVar10 = findId(program,"u_sceneNormal;");
  local_170 = (Model *)CONCAT71(local_170._1_7_,bVar10);
  bVar10 = findId(program,"u_lightShadowMap;");
  pSVar9 = local_270;
  local_270->m_shadows = bVar10;
  iVar11 = countSceneBuffers(local_278);
  iVar12 = countSceneBuffers(program);
  if (iVar12 < iVar11) {
    iVar12 = iVar11;
  }
  pSVar9->m_buffers_total = (long)iVar12;
  p_Var17 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var17 != local_a8) {
    paVar4 = &local_2b8.field_2;
    do {
      vera::Model::setShader(*(Model **)(p_Var17 + 2),local_268,local_278);
      if (local_270->m_shadows == true) {
        pMVar18 = *(Model **)(p_Var17 + 2);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"shadow","");
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0xb,_type);
        vera::Model::setBufferShader(pMVar18,&local_c8,(string *)local_240,local_278);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((char)local_178 != '\0') {
        pMVar18 = *(Model **)(p_Var17 + 2);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"position","");
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x12,_type_00);
        vera::Model::setBufferShader(pMVar18,&local_e8,(string *)local_240,local_278);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((char)local_170 != '\0') {
        pMVar18 = *(Model **)(p_Var17 + 2);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"normal","");
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x13,_type_01);
        vera::Model::setBufferShader(pMVar18,&local_108,(string *)local_240,local_278);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      local_260._M_dataplus._M_p = (pointer)0x0;
      if (local_270->m_buffers_total != 0) {
        do {
          vera::toString<unsigned_long>(&local_2b8,(unsigned_long *)&local_260);
          plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2dfd9d);
          local_240._0_8_ = local_240 + 0x10;
          psVar20 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar20) {
            local_240._16_8_ = *psVar20;
            local_240._24_8_ = plVar15[3];
          }
          else {
            local_240._16_8_ = *psVar20;
            local_240._0_8_ = (size_type *)*plVar15;
          }
          local_240._8_8_ = plVar15[1];
          *plVar15 = (long)psVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar4) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          pMVar18 = *(Model **)(p_Var17 + 2);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_240._0_8_,
                     (pointer)((long)(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3
                                      *)local_240._8_8_ + local_240._0_8_));
          vera::Model::setBufferShader(pMVar18,&local_148,local_268,local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          ppSVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                   *)(*(long *)(p_Var17 + 2) + 600),(string *)local_240);
          pSVar5 = *ppSVar16;
          local_2b8._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"FLOOR","");
          (*(pSVar5->super_HaveDefines)._vptr_HaveDefines[0xb])(pSVar5,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar4) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          ppSVar16 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                   *)(*(long *)(p_Var17 + 2) + 600),(string *)local_240);
          pSVar5 = *ppSVar16;
          vera::toString<unsigned_long>(&local_298,(unsigned_long *)&local_260);
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x2dfd49);
          psVar20 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_2b8.field_2._M_allocated_capacity = *psVar20;
            local_2b8.field_2._8_8_ = puVar14[3];
            local_2b8._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_2b8.field_2._M_allocated_capacity = *psVar20;
            local_2b8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_2b8._M_string_length = puVar14[1];
          *puVar14 = psVar20;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
          (*(pSVar5->super_HaveDefines)._vptr_HaveDefines[10])
                    (pSVar5,&local_2b8,(string *)local_198);
          if ((Model *)local_198._0_8_ != (Model *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar4) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
            operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
          }
          local_260._M_dataplus._M_p = local_260._M_dataplus._M_p + 1;
        } while (local_260._M_dataplus._M_p < (pointer)local_270->m_buffers_total);
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != local_a8);
  }
  bVar10 = checkFloor(local_268);
  if ((bVar10) || (bVar10 = checkFloor(local_278), bVar10)) {
    pMVar18 = &local_270->m_floor;
    if ((local_270->m_floor).m_model_vbo == (Vbo *)0x0) {
      local_240._0_8_ = local_240 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"FLOOR","");
      vera::Model::setName(pMVar18,(string *)local_240);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      vera::planeMesh((Mesh *)local_240,1.0,1.0,2,2,TRIANGLES);
      vera::Model::setGeom(pMVar18,(Mesh *)local_240);
      vera::Mesh::~Mesh((Mesh *)local_240);
    }
    pSVar9 = local_270;
    vera::Model::setShader(pMVar18,local_268,local_278);
    if (pSVar9->m_floor_subd == -1) {
      pSVar9->m_floor_subd_target = 0;
    }
    if (pSVar9->m_shadows == true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"shadow","");
      vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0xb,_type_02);
      vera::Model::setBufferShader(pMVar18,&local_50,(string *)local_240,local_278);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)local_178 != '\0') {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"position","");
      vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x12,_type_03);
      vera::Model::setBufferShader(pMVar18,&local_70,(string *)local_240,local_278);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)local_170 != '\0') {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"normal","");
      vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x13,_type_04);
      vera::Model::setBufferShader(pMVar18,&local_90,(string *)local_240,local_278);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    local_260._M_dataplus._M_p = (pointer)0x0;
    local_170 = pMVar18;
    if (local_270->m_buffers_total != 0) {
      paVar4 = &local_2b8.field_2;
      local_178 = &(local_270->m_floor).gBuffersShaders;
      do {
        vera::toString<unsigned_long>(&local_2b8,(unsigned_long *)&local_260);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2dfd9d);
        local_240._0_8_ = local_240 + 0x10;
        psVar20 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar20) {
          local_240._16_8_ = *psVar20;
          local_240._24_8_ = plVar15[3];
        }
        else {
          local_240._16_8_ = *psVar20;
          local_240._0_8_ = (size_type *)*plVar15;
        }
        local_240._8_8_ = plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar4) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_240._0_8_,
                   (pointer)((long)(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *
                                   )local_240._8_8_ + local_240._0_8_));
        vera::Model::setBufferShader(local_170,&local_168,local_268,local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        ppSVar16 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[](local_178,(key_type *)local_240);
        pSVar5 = *ppSVar16;
        local_2b8._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"FLOOR","");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"","");
        (*(pSVar5->super_HaveDefines)._vptr_HaveDefines[10])(pSVar5,&local_2b8,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar4) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        ppSVar16 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[](local_178,(key_type *)local_240);
        pSVar5 = *ppSVar16;
        vera::toString<unsigned_long>(&local_298,(unsigned_long *)&local_260);
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x2dfd49);
        psVar20 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8.field_2._8_8_ = puVar14[3];
          local_2b8._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_2b8._M_string_length = puVar14[1];
        *puVar14 = psVar20;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        local_198._0_8_ = local_198 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"","");
        (*(pSVar5->super_HaveDefines)._vptr_HaveDefines[10])(pSVar5,&local_2b8,(string *)local_198);
        if ((Model *)local_198._0_8_ != (Model *)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != paVar4) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        local_260._M_dataplus._M_p = local_260._M_dataplus._M_p + 1;
      } while (local_260._M_dataplus._M_p < (pointer)local_270->m_buffers_total);
    }
  }
  uVar13 = countDevLookSpheres(local_268);
  lVar22 = (long)(int)uVar13;
  pvVar2 = &local_270->m_devlook_spheres;
  ppMVar6 = (local_270->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar7 = (local_270->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppMVar7 - (long)ppMVar6 >> 3 == lVar22) {
    if (0 < (int)uVar13) {
      uVar25 = 0;
      do {
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar25];
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x19,(DefaultShaders)lVar22);
        vera::Model::setShader(pMVar18,local_268,(string *)local_240);
        lVar22 = extraout_RDX;
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
          lVar22 = extraout_RDX_00;
        }
        uVar25 = uVar25 + 1;
      } while (uVar13 != uVar25);
    }
  }
  else {
    if (ppMVar7 != ppMVar6) {
      (local_270->m_devlook_spheres).
      super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar6;
    }
    local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffff00000000;
    if (0 < (int)uVar13) {
      local_278 = (string *)CONCAT44(local_278._4_4_,uVar13);
      do {
        pMVar18 = (Model *)operator_new(0x2d8);
        vera::toString<int>(&local_298,(int *)&local_260);
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x2dfd57);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        psVar20 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8.field_2._8_8_ = puVar14[3];
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_2b8._M_string_length = puVar14[1];
        *puVar14 = psVar20;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        vera::sphereMesh((Mesh *)local_240,0x18,1.0,TRIANGLES);
        vera::Model::Model(pMVar18,&local_2b8,(Mesh *)local_240);
        iVar8._M_current =
             (local_270->m_devlook_spheres).
             super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_198._0_8_ = pMVar18;
        if (iVar8._M_current ==
            (local_270->m_devlook_spheres).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Model*,std::allocator<vera::Model*>>::_M_realloc_insert<vera::Model*>
                    ((vector<vera::Model*,std::allocator<vera::Model*>> *)pvVar2,iVar8,
                     (Model **)local_198);
        }
        else {
          *iVar8._M_current = pMVar18;
          pppMVar3 = &(local_270->m_devlook_spheres).
                      super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppMVar3 = *pppMVar3 + 1;
        }
        vera::Mesh::~Mesh((Mesh *)local_240);
        DVar21 = extraout_EDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          DVar21 = extraout_EDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          DVar21 = extraout_EDX_04;
        }
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p];
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x19,DVar21);
        vera::Model::setShader(pMVar18,local_268,(string *)local_240);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        pSVar24 = &(pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p]->
                   mainShader;
        vera::toString<int>(&local_2b8,(int *)&local_260);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2dfd57);
        local_240._0_8_ = local_240 + 0x10;
        psVar20 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar20) {
          local_240._16_8_ = *psVar20;
          local_240._24_8_ = plVar15[3];
        }
        else {
          local_240._16_8_ = *psVar20;
          local_240._0_8_ = (size_type *)*plVar15;
        }
        local_240._8_8_ = plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
        (**(code **)((long)(pSVar24->super_HaveDefines)._vptr_HaveDefines + 0x50))
                  (pSVar24,(Mesh *)local_240,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p];
        local_240._0_8_ = local_240 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"DEVLOOK_Y_OFFSET","");
        (**(code **)((long)(pMVar18->mainShader).super_HaveDefines._vptr_HaveDefines + 0x20))
                  ((double)(int)local_260._M_dataplus._M_p * -0.35 + 0.8,&pMVar18->mainShader,
                   (Mesh *)local_240);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        iVar12 = (int)local_260._M_dataplus._M_p + 1;
        local_260._M_dataplus._M_p._0_4_ = iVar12;
      } while (iVar12 < (int)local_278);
    }
  }
  uVar13 = countDevLookBillboards(local_268);
  lVar22 = (long)(int)uVar13;
  pvVar2 = &local_270->m_devlook_billboards;
  ppMVar6 = (local_270->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar7 = (local_270->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppMVar7 - (long)ppMVar6 >> 3 == lVar22) {
    if (0 < (int)uVar13) {
      uVar25 = 0;
      do {
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar25];
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x18,(DefaultShaders)lVar22);
        vera::Model::setShader(pMVar18,local_268,(string *)local_240);
        lVar22 = extraout_RDX_01;
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
          lVar22 = extraout_RDX_02;
        }
        uVar25 = uVar25 + 1;
      } while (uVar13 != uVar25);
    }
  }
  else {
    if (ppMVar7 != ppMVar6) {
      (local_270->m_devlook_billboards).
      super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar6;
    }
    local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffff00000000;
    if (0 < (int)uVar13) {
      local_278 = (string *)CONCAT44(local_278._4_4_,uVar13);
      do {
        pMVar18 = (Model *)operator_new(0x2d8);
        vera::toString<int>(&local_298,(int *)&local_260);
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x2dfd78);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        psVar20 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8.field_2._8_8_ = puVar14[3];
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar20;
          local_2b8._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_2b8._M_string_length = puVar14[1];
        *puVar14 = psVar20;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        vera::planeMesh((Mesh *)local_240,1.0,1.0,2,2,TRIANGLES);
        vera::Model::Model(pMVar18,&local_2b8,(Mesh *)local_240);
        iVar8._M_current =
             (local_270->m_devlook_billboards).
             super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_198._0_8_ = pMVar18;
        if (iVar8._M_current ==
            (local_270->m_devlook_billboards).
            super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Model*,std::allocator<vera::Model*>>::_M_realloc_insert<vera::Model*>
                    ((vector<vera::Model*,std::allocator<vera::Model*>> *)pvVar2,iVar8,
                     (Model **)local_198);
        }
        else {
          *iVar8._M_current = pMVar18;
          pppMVar3 = &(local_270->m_devlook_billboards).
                      super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppMVar3 = *pppMVar3 + 1;
        }
        vera::Mesh::~Mesh((Mesh *)local_240);
        DVar21 = extraout_EDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          DVar21 = extraout_EDX_06;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          DVar21 = extraout_EDX_07;
        }
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p];
        vera::getDefaultSrc_abi_cxx11_((string *)local_240,(vera *)0x18,DVar21);
        vera::Model::setShader(pMVar18,local_268,(string *)local_240);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        pSVar24 = &(pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p]->
                   mainShader;
        vera::toString<int>(&local_2b8,(int *)&local_260);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x2dfd78);
        local_240._0_8_ = local_240 + 0x10;
        psVar20 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar20) {
          local_240._16_8_ = *psVar20;
          local_240._24_8_ = plVar15[3];
        }
        else {
          local_240._16_8_ = *psVar20;
          local_240._0_8_ = (size_type *)*plVar15;
        }
        local_240._8_8_ = plVar15[1];
        *plVar15 = (long)psVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
        (**(code **)((long)(pSVar24->super_HaveDefines)._vptr_HaveDefines + 0x50))
                  (pSVar24,(Mesh *)local_240,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        pMVar18 = (pvVar2->super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[(int)local_260._M_dataplus._M_p];
        local_240._0_8_ = local_240 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"DEVLOOK_Y_OFFSET","");
        lVar22 = (long)(local_270->m_devlook_spheres).
                       super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_270->m_devlook_spheres).
                       super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
        lVar19 = lVar22 >> 3;
        auVar26._8_4_ = (int)(lVar22 >> 0x23);
        auVar26._0_8_ = lVar19;
        auVar26._12_4_ = 0x45300000;
        (**(code **)((long)(pMVar18->mainShader).super_HaveDefines._vptr_HaveDefines + 0x20))
                  ((double)(int)local_260._M_dataplus._M_p * -0.325 +
                   ((auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) * -0.35 + 0.8,
                   &pMVar18->mainShader,(Mesh *)local_240);
        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        iVar12 = (int)local_260._M_dataplus._M_p + 1;
        local_260._M_dataplus._M_p._0_4_ = iVar12;
      } while (iVar12 < (int)local_278);
    }
  }
  return;
}

Assistant:

void SceneRender::setShaders(Uniforms& _uniforms, const std::string& _fragmentShader, const std::string& _vertexShader) {
    // Background
    m_background = checkBackground(_fragmentShader);
    if (m_background) {
        // Specific defines for this buffer
        m_background_shader.addDefine("BACKGROUND");
        m_background_shader.setSource(_fragmentShader, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        m_background_shader.addDefine("GLSLVIEWER", vera::toString(GLSLVIEWER_VERSION_MAJOR) + vera::toString(GLSLVIEWER_VERSION_MINOR) + vera::toString(GLSLVIEWER_VERSION_PATCH) );
    }

    bool position_buffer = findId(_fragmentShader, "u_scenePosition;");
    bool normal_buffer = findId(_fragmentShader, "u_sceneNormal;");
    m_shadows = findId(_fragmentShader, "u_lightShadowMap;");
    m_buffers_total = std::max( countSceneBuffers(_vertexShader), 
                                countSceneBuffers(_fragmentShader) );

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        it->second->setShader( _fragmentShader, _vertexShader);

        if (m_shadows)
            it->second->setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            it->second->setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            it->second->setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            it->second->setBufferShader(bufferName, _fragmentShader, _vertexShader);
            it->second->getBufferShader(bufferName)->delDefine("FLOOR");
            it->second->getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // Floor
    bool thereIsFloorDefine = checkFloor(_fragmentShader) || checkFloor(_vertexShader);
    if (thereIsFloorDefine) {
        if (m_floor.getVbo() == nullptr) {
            m_floor.setName("FLOOR");
            m_floor.setGeom( vera::planeMesh(1.0f, 1.0f, 2, 2) );
        }

        m_floor.setShader(_fragmentShader, _vertexShader);

        if (m_floor_subd == -1)
            m_floor_subd_target = 0;

        if (m_shadows) 
            m_floor.setBufferShader("shadow", vera::getDefaultSrc(vera::FRAG_ERROR), _vertexShader);

        if (position_buffer)
            m_floor.setBufferShader("position", vera::getDefaultSrc(vera::FRAG_POSITION), _vertexShader);
        
        if (normal_buffer)
            m_floor.setBufferShader("normal", vera::getDefaultSrc(vera::FRAG_NORMAL), _vertexShader);

        for (size_t i = 0; i < m_buffers_total; i++) {
            std::string bufferName = "u_sceneBuffer" + vera::toString(i);
            m_floor.setBufferShader(bufferName, _fragmentShader, _vertexShader);
            m_floor.getBufferShader(bufferName)->addDefine("FLOOR");
            m_floor.getBufferShader(bufferName)->addDefine("SCENE_BUFFER_" + vera::toString(i));
        }
    }

    // DevLook
    int devLookSpheres = countDevLookSpheres(_fragmentShader);
    if (devLookSpheres != m_devlook_spheres.size()) {
        m_devlook_spheres.clear();

        for (int i = 0; i < devLookSpheres; i++) {
            m_devlook_spheres.push_back( new vera::Model("DEVLOOK_SPHERE_" + vera::toString(i), vera::sphereMesh(24)) );

            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_SPHERE_" + vera::toString(i));
            m_devlook_spheres[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - i * 0.35);
        }
    }
    else if (devLookSpheres > 0)
        for (int i = 0; i < devLookSpheres; i++)
            m_devlook_spheres[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_SPHERE));

    int devLookBillboards = countDevLookBillboards(_fragmentShader);
    if (devLookBillboards != m_devlook_billboards.size()) {
        m_devlook_billboards.clear();

        for (int i = 0; i < devLookBillboards; i++) {
            m_devlook_billboards.push_back( new vera::Model("DEVLOOK_BILLBOARD_" + vera::toString(i), vera::planeMesh(1.0f, 1.0f, 2, 2)) );

            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_BILLBOARD_" + vera::toString(i));
            m_devlook_billboards[i]->getShader()->addDefine("DEVLOOK_Y_OFFSET", 0.8 - m_devlook_spheres.size() * 0.35 - i * 0.325);
        }
    }
    else if (devLookBillboards > 0)
        for (int i = 0; i < devLookBillboards; i++)
            m_devlook_billboards[i]->setShader(_fragmentShader, vera::getDefaultSrc(vera::VERT_DEVLOOK_BILLBOARD));

}